

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O3

void __thiscall boost::runtime::basic_param::value_help(basic_param *this,ostream *ostr)

{
  size_type sVar1;
  
  sVar1 = (this->p_value_hint)._M_string_length;
  if (sVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (ostr,(this->p_value_hint)._M_dataplus._M_p,sVar1);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostr,"<value>",7);
  return;
}

Assistant:

virtual void            value_help( std::ostream& ostr ) const
    {
        if( p_value_hint.empty() )
            ostr << "<value>";
        else
            ostr << p_value_hint;
    }